

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

void __thiscall Fl_Widget_Type::redraw(Fl_Widget_Type *this)

{
  int iVar1;
  bool bVar2;
  Fl_Widget_Type *local_18;
  Fl_Type *t;
  Fl_Widget_Type *this_local;
  
  iVar1 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1e])();
  local_18 = this;
  if (iVar1 == 0) {
    while( true ) {
      bVar2 = false;
      if ((local_18->super_Fl_Type).parent != (Fl_Type *)0x0) {
        iVar1 = (*((local_18->super_Fl_Type).parent)->_vptr_Fl_Type[0x17])();
        bVar2 = iVar1 != 0;
      }
      if (!bVar2) break;
      local_18 = (Fl_Widget_Type *)(local_18->super_Fl_Type).parent;
    }
    Fl_Widget::redraw(local_18->o);
  }
  else {
    do {
      local_18 = (Fl_Widget_Type *)(local_18->super_Fl_Type).parent;
      bVar2 = false;
      if (local_18 != (Fl_Widget_Type *)0x0) {
        iVar1 = (*(local_18->super_Fl_Type)._vptr_Fl_Type[0x1e])();
        bVar2 = iVar1 != 0;
      }
    } while (bVar2);
    (*(local_18->super_Fl_Type)._vptr_Fl_Type[8])(local_18,0);
  }
  return;
}

Assistant:

void Fl_Widget_Type::redraw() {
  Fl_Type *t = this;
  if (is_menu_item()) {
    // find the menu button that parents this menu:
    do t = t->parent; while (t && t->is_menu_item());
    // kludge to cause build_menu to be called again:
    t->add_child(0,0);
  } else {
    while (t->parent && t->parent->is_widget()) t = t->parent;
    ((Fl_Widget_Type*)t)->o->redraw();
  }
}